

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

Node * prvTidyParseTableTag(TidyDocImpl *doc,Node *table,GetTokenMode mode)

{
  uint uVar1;
  Lexer *pLVar2;
  TidyParserMemory data;
  TidyParserMemory data_00;
  Bool BVar3;
  code *pcStack_d8;
  TidyParserMemory memory_2;
  TidyParserMemory memory_1;
  TidyParserMemory memory;
  Node *pNStack_40;
  uint istackbase;
  Node *parent;
  Node *node;
  Lexer *lexer;
  Node *pNStack_20;
  GetTokenMode mode_local;
  Node *table_local;
  TidyDocImpl *doc_local;
  
  pLVar2 = doc->lexer;
  if (table == (Node *)0x0) {
    prvTidypopMemory((TidyParserMemory *)&memory_1.register_2,doc);
    pNStack_20 = (Node *)memory.identity;
    pLVar2->exiled = memory.reentry_state;
  }
  else {
    prvTidyDeferDup(doc);
    pNStack_20 = table;
  }
  uVar1 = pLVar2->istackbase;
  pLVar2->istackbase = pLVar2->istacksize;
LAB_0014d792:
  while( true ) {
    while( true ) {
      do {
        parent = prvTidyGetToken(doc,IgnoreWhitespace);
        if (parent == (Node *)0x0) {
          prvTidyReport(doc,pNStack_20,(Node *)0x0,0x25a);
          pLVar2->istackbase = uVar1;
          return (Node *)0x0;
        }
        if (parent->tag == pNStack_20->tag) {
          if (parent->type == EndTag) {
            prvTidyFreeNode(doc,parent);
          }
          else {
            prvTidyUngetToken(doc);
            prvTidyReport(doc,pNStack_20,parent,0x27e);
          }
          pLVar2->istackbase = uVar1;
          pNStack_20->closed = yes;
          return (Node *)0x0;
        }
        BVar3 = InsertMisc(pNStack_20,parent);
      } while (BVar3 != no);
      if ((parent->tag != (Dict *)0x0) || (parent->type == TextNode)) break;
      prvTidyReport(doc,pNStack_20,parent,0x235);
      prvTidyFreeNode(doc,parent);
    }
    if (parent->type == EndTag) break;
    if (((((parent != (Node *)0x0) && (parent->tag != (Dict *)0x0)) &&
         (parent->tag->id == TidyTag_TD)) ||
        (((parent != (Node *)0x0 && (parent->tag != (Dict *)0x0)) && (parent->tag->id == TidyTag_TH)
         ))) || (((parent != (Node *)0x0 && (parent->tag != (Dict *)0x0)) &&
                 (parent->tag->id == TidyTag_TABLE)))) {
      prvTidyUngetToken(doc);
      parent = prvTidyInferredTag(doc,TidyTag_TR);
      prvTidyReport(doc,pNStack_20,parent,0x261);
      break;
    }
    BVar3 = prvTidynodeIsText(parent);
    if ((BVar3 == no) && (BVar3 = prvTidynodeHasCM(parent,0x18), BVar3 == no)) {
      if ((parent->tag->model & 4) == 0) break;
      MoveToHead(doc,pNStack_20,parent);
    }
    else {
      prvTidyInsertNodeBeforeElement(pNStack_20,parent);
      prvTidyReport(doc,pNStack_20,parent,0x27e);
      pLVar2->exiled = yes;
      if (parent->type != TextNode) {
        memset(&memory_2.register_2,0,0x30);
        memory_2._40_8_ = prvTidyParseTableTag;
        memory_1.identity = (Parser *)pNStack_20;
        memory_1.reentry_state = 0;
        memory_1.reentry_mode = IgnoreWhitespace;
        data.original_node = pNStack_20;
        data.identity = prvTidyParseTableTag;
        data.reentry_node = parent;
        data._24_8_ = memory_1.reentry_node;
        data.mode = IgnoreWhitespace;
        data.register_1 = 0;
        data.register_2 = memory_1.mode;
        data._44_4_ = memory_1.register_1;
        memory_1.original_node = parent;
        prvTidypushMemory(doc,data);
        return parent;
      }
      pLVar2->exiled = no;
    }
  }
  if (parent->type == EndTag) {
    if (((parent != (Node *)0x0) && (parent->tag != (Dict *)0x0)) &&
       (parent->tag->id == TidyTag_FORM)) {
      BadForm(doc);
      prvTidyReport(doc,pNStack_20,parent,0x235);
      prvTidyFreeNode(doc,parent);
      goto LAB_0014d792;
    }
    BVar3 = prvTidynodeHasCM(parent,0x280);
    if ((BVar3 != no) || (BVar3 = prvTidynodeHasCM(parent,0x18), BVar3 != no)) {
      prvTidyReport(doc,pNStack_20,parent,0x235);
      prvTidyFreeNode(doc,parent);
      goto LAB_0014d792;
    }
    for (pNStack_40 = pNStack_20->parent; pNStack_40 != (Node *)0x0; pNStack_40 = pNStack_40->parent
        ) {
      if (parent->tag == pNStack_40->tag) {
        prvTidyReport(doc,pNStack_20,parent,0x259);
        prvTidyUngetToken(doc);
        pLVar2->istackbase = uVar1;
        return (Node *)0x0;
      }
    }
  }
  if ((parent->tag->model & 0x80) == 0) {
    prvTidyUngetToken(doc);
    prvTidyReport(doc,pNStack_20,parent,0x27e);
    pLVar2->istackbase = uVar1;
    return (Node *)0x0;
  }
  BVar3 = prvTidynodeIsElement(parent);
  if (BVar3 != no) {
    memset(&pcStack_d8,0,0x30);
    prvTidyInsertNodeAtEnd(pNStack_20,parent);
    pcStack_d8 = prvTidyParseTableTag;
    memory_2.identity = (Parser *)pNStack_20;
    memory_2.original_node = parent;
    memory_2.reentry_state = pLVar2->exiled;
    data_00.register_1 = memory_2.reentry_state;
    data_00.mode = memory_2.reentry_mode;
    data_00.original_node = pNStack_20;
    data_00.identity = prvTidyParseTableTag;
    data_00.reentry_node = parent;
    data_00._24_8_ = memory_2.reentry_node;
    data_00.register_2 = memory_2.mode;
    data_00._44_4_ = memory_2.register_1;
    prvTidypushMemory(doc,data_00);
    return parent;
  }
  prvTidyReport(doc,pNStack_20,parent,0x235);
  prvTidyFreeNode(doc,parent);
  goto LAB_0014d792;
}

Assistant:

Node* TY_(ParseTableTag)( TidyDocImpl* doc, Node *table, GetTokenMode ARG_UNUSED(mode) )
{
    Lexer* lexer = doc->lexer;
    Node *node, *parent;
    uint istackbase;
    DEBUG_LOG_COUNTERS;

    if ( table == NULL )
    {
        TidyParserMemory memory = TY_(popMemory)( doc );
        node = memory.reentry_node; /* Throwaway, as main loop overrwrites anyway. */
        DEBUG_LOG_REENTER_WITH_NODE(node);
        table = memory.original_node;
        lexer->exiled = memory.register_1;
        DEBUG_LOG_GET_OLD_MODE;
        mode = memory.mode;
        DEBUG_LOG_CHANGE_MODE;
    }
    else
    {
        DEBUG_LOG_ENTER_WITH_NODE(table);
        TY_(DeferDup)( doc );
    }

    istackbase = lexer->istackbase;
    lexer->istackbase = lexer->istacksize;

    while ((node = TY_(GetToken)(doc, IgnoreWhitespace)) != NULL)
    {
        DEBUG_LOG_GOT_TOKEN(node);
        if (node->tag == table->tag )
        {
            if (node->type == EndTag)
            {
                TY_(FreeNode)(doc, node);
            }
            else
            {
                /* Issue #498 - If a <table> in a <table>
                 * just close the current table, and issue a
                 * warning. The previous action was to discard
                 * this second <table>
                 */
                TY_(UngetToken)(doc);
                TY_(Report)(doc, table, node, TAG_NOT_ALLOWED_IN);
            }
            lexer->istackbase = istackbase;
            table->closed = yes;

            DEBUG_LOG_EXIT;
            return NULL;
        }

        /* deal with comments etc. */
        if (InsertMisc(table, node))
            continue;

        /* discard unknown tags */
        if (node->tag == NULL && node->type != TextNode)
        {
            TY_(Report)(doc, table, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)( doc, node);
            continue;
        }

        /* if TD or TH or text or inline or block then infer <TR> */

        if (node->type != EndTag)
        {
            if ( nodeIsTD(node) || nodeIsTH(node) || nodeIsTABLE(node) )
            {
                TY_(UngetToken)( doc );
                node = TY_(InferredTag)(doc, TidyTag_TR);
                TY_(Report)(doc, table, node, MISSING_STARTTAG);
            }
            else if ( TY_(nodeIsText)(node) ||TY_(nodeHasCM)(node,CM_BLOCK|CM_INLINE) )
            {
                TY_(InsertNodeBeforeElement)(table, node);
                TY_(Report)(doc, table, node, TAG_NOT_ALLOWED_IN);
                lexer->exiled = yes;

                if (node->type != TextNode)
                {
                    TidyParserMemory memory = {0};
                    memory.identity = TY_(ParseTableTag);
                    memory.original_node = table;
                    memory.reentry_node = node;
                    memory.register_1 = no; /* later, lexer->exiled = no */
                    memory.mode = IgnoreWhitespace;
                    TY_(pushMemory)( doc, memory );
                    DEBUG_LOG_EXIT_WITH_NODE(node);
                    return node;
                }

                lexer->exiled = no;
                continue;
            }
            else if (node->tag->model & CM_HEAD)
            {
                MoveToHead(doc, table, node);
                continue;
            }
        }

        /*
          if this is the end tag for an ancestor element
          then infer end tag for this element
        */
        if (node->type == EndTag)
        {
            if ( nodeIsFORM(node) )
            {
                BadForm( doc );
                TY_(Report)(doc, table, node, DISCARDING_UNEXPECTED);
                TY_(FreeNode)( doc, node);
                continue;
            }

            /* best to discard unexpected block/inline end tags */
            if ( TY_(nodeHasCM)(node, CM_TABLE|CM_ROW) ||
                 TY_(nodeHasCM)(node, CM_BLOCK|CM_INLINE) )
            {
                TY_(Report)(doc, table, node, DISCARDING_UNEXPECTED);
                TY_(FreeNode)( doc, node);
                continue;
            }

            for ( parent = table->parent;
                  parent != NULL;
                  parent = parent->parent )
            {
                if (node->tag == parent->tag)
                {
                    TY_(Report)(doc, table, node, MISSING_ENDTAG_BEFORE );
                    TY_(UngetToken)( doc );
                    lexer->istackbase = istackbase;

                    DEBUG_LOG_EXIT;
                    return NULL;
                }
            }
        }

        if (!(node->tag->model & CM_TABLE))
        {
            TY_(UngetToken)( doc );
            TY_(Report)(doc, table, node, TAG_NOT_ALLOWED_IN);
            lexer->istackbase = istackbase;

            DEBUG_LOG_EXIT;
            return NULL;
        }

        if (TY_(nodeIsElement)(node))
        {
            TidyParserMemory memory = {0};
            TY_(InsertNodeAtEnd)(table, node);
            memory.identity = TY_(ParseTableTag);
            memory.original_node = table;
            memory.reentry_node = node;
            memory.register_1 = lexer->exiled;
            TY_(pushMemory)( doc, memory );
            DEBUG_LOG_EXIT_WITH_NODE(node);
            return node;
        }

        /* discard unexpected text nodes and end tags */
        TY_(Report)(doc, table, node, DISCARDING_UNEXPECTED);
        TY_(FreeNode)( doc, node);
    }

    TY_(Report)(doc, table, node, MISSING_ENDTAG_FOR);
    lexer->istackbase = istackbase;

    DEBUG_LOG_EXIT;
    return NULL;
}